

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O1

void __thiscall TargetImageWidget::paintEvent(TargetImageWidget *this,QPaintEvent *param_1)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPainter p;
  QPen targetAreaPen;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  double local_20;
  double local_18;
  
  QPainter::QPainter((QPainter *)local_40,(QPaintDevice *)&(this->super_PanAndZoomWidget).field_0x10
                    );
  QBrush::QBrush((QBrush *)local_30,white,SolidPattern);
  QPainter::setBackground((QBrush *)local_40);
  QBrush::~QBrush((QBrush *)local_30);
  PaintImage(this,(QPainter *)local_40);
  QPainter::setCompositionMode((CompositionMode)local_40);
  QColor::QColor((QColor *)local_30,white);
  QPen::QPen((QPen *)(local_40 + 8),(QColor *)local_30);
  QPen::setWidthF(5.0);
  QPen::setStyle((int)local_40 + 8);
  QPainter::setPen((QPen *)local_40);
  lVar1 = *(long *)&(this->super_PanAndZoomWidget).field_0x20;
  iVar2 = (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1;
  iVar4 = (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1;
  iVar3 = iVar2;
  if (iVar4 < iVar2) {
    iVar3 = iVar4;
  }
  local_20 = (double)iVar3;
  local_30._0_8_ = ((double)iVar2 - local_20) * 0.5;
  local_30._8_8_ = ((double)iVar4 - local_20) * 0.5;
  local_18 = local_20;
  QPainter::drawRects((QRectF *)local_40,(int)local_30);
  QPen::~QPen((QPen *)(local_40 + 8));
  QPainter::~QPainter((QPainter *)local_40);
  return;
}

Assistant:

void TargetImageWidget::paintEvent(QPaintEvent* /*event*/)
{
    QPainter p(this);
    p.setBackground(QBrush(Qt::white));

    PaintImage(p);

    // Draw bounds that need filling
    p.setCompositionMode(QPainter::CompositionMode_Difference);

    QPen targetAreaPen(Qt::white);
    targetAreaPen.setWidthF(qreal{ 5.0 });
    targetAreaPen.setStyle(Qt::PenStyle::DashLine);
    p.setPen(targetAreaPen);

    p.drawRect(GetTargetRect());
}